

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_8.c
# Opt level: O2

void arr_store_rowcol(int *row,int *col,__m256i vWH,int32_t i,int32_t s1Len,int32_t j,int32_t s2Len)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  char cVar9;
  uint uVar10;
  undefined4 in_XMM0_Da;
  undefined1 in_register_00001204 [12];
  undefined8 in_YMM0_H;
  
  uVar8 = s1Len - 1;
  cVar1 = (char)((ulong)in_YMM0_H >> 0x38);
  if ((j < s2Len && -1 < j) && uVar8 == i) {
    row[(uint)j] = (int)cVar1;
  }
  if (((i < s1Len) && (-1 < i)) && (s2Len + -1 == j)) {
    col[(uint)i] = (int)cVar1;
  }
  uVar10 = i + 1;
  cVar2 = (char)((ulong)in_YMM0_H >> 0x30);
  if ((j <= s2Len && 0 < j) && uVar10 == uVar8) {
    row[(ulong)(uint)j - 1] = (int)cVar2;
  }
  if ((((int)uVar10 < s1Len) && (-2 < i)) && (j == s2Len)) {
    col[uVar10] = (int)cVar2;
  }
  uVar10 = i + 2;
  cVar3 = (char)((ulong)in_YMM0_H >> 0x28);
  if ((uVar10 == uVar8) && ((int)(j - 2U) < s2Len && 1 < j)) {
    row[j - 2U] = (int)cVar3;
  }
  if ((((int)uVar10 < s1Len) && (-3 < i)) && (j + -1 == s2Len)) {
    col[uVar10] = (int)cVar3;
  }
  uVar10 = i + 3;
  cVar4 = (char)((ulong)in_YMM0_H >> 0x20);
  if ((uVar10 == uVar8) && ((int)(j - 3U) < s2Len && 2 < j)) {
    row[j - 3U] = (int)cVar4;
  }
  if ((((int)uVar10 < s1Len) && (-4 < i)) && (j + -2 == s2Len)) {
    col[uVar10] = (int)cVar4;
  }
  uVar10 = i + 4;
  cVar5 = (char)((ulong)in_YMM0_H >> 0x18);
  if ((uVar10 == uVar8) && ((int)(j - 4U) < s2Len && 3 < j)) {
    row[j - 4U] = (int)cVar5;
  }
  if ((((int)uVar10 < s1Len) && (-5 < i)) && (j + -3 == s2Len)) {
    col[uVar10] = (int)cVar5;
  }
  uVar10 = i + 5;
  cVar6 = (char)((ulong)in_YMM0_H >> 0x10);
  if ((uVar10 == uVar8) && ((int)(j - 5U) < s2Len && 4 < j)) {
    row[j - 5U] = (int)cVar6;
  }
  if ((((int)uVar10 < s1Len) && (-6 < i)) && (j + -4 == s2Len)) {
    col[uVar10] = (int)cVar6;
  }
  uVar10 = i + 6;
  cVar7 = (char)((ulong)in_YMM0_H >> 8);
  if ((uVar10 == uVar8) && ((int)(j - 6U) < s2Len && 5 < j)) {
    row[j - 6U] = (int)cVar7;
  }
  if ((((int)uVar10 < s1Len) && (-7 < i)) && (j + -5 == s2Len)) {
    col[uVar10] = (int)cVar7;
  }
  uVar10 = i + 7;
  cVar9 = (char)in_YMM0_H;
  if ((uVar10 == uVar8) && ((int)(j - 7U) < s2Len && 6 < j)) {
    row[j - 7U] = (int)cVar9;
  }
  if ((((int)uVar10 < s1Len) && (-8 < i)) && (j + -6 == s2Len)) {
    col[uVar10] = (int)cVar9;
  }
  uVar10 = i + 8;
  if ((uVar10 == uVar8) && ((int)(j - 8U) < s2Len && 7 < j)) {
    row[j - 8U] = (int)cVar1;
  }
  if ((((int)uVar10 < s1Len) && (-9 < i)) && (j + -7 == s2Len)) {
    col[uVar10] = (int)cVar1;
  }
  uVar10 = i + 9;
  if ((uVar10 == uVar8) && ((int)(j - 9U) < s2Len && 8 < j)) {
    row[j - 9U] = (int)cVar2;
  }
  if ((((int)uVar10 < s1Len) && (-10 < i)) && (j + -8 == s2Len)) {
    col[uVar10] = (int)cVar2;
  }
  uVar10 = i + 10;
  if ((uVar10 == uVar8) && ((int)(j - 10U) < s2Len && 9 < j)) {
    row[j - 10U] = (int)cVar3;
  }
  if ((((int)uVar10 < s1Len) && (-0xb < i)) && (j + -9 == s2Len)) {
    col[uVar10] = (int)cVar3;
  }
  uVar10 = i + 0xb;
  if ((uVar10 == uVar8) && ((int)(j - 0xbU) < s2Len && 10 < j)) {
    row[j - 0xbU] = (int)cVar4;
  }
  if ((((int)uVar10 < s1Len) && (-0xc < i)) && (j + -10 == s2Len)) {
    col[uVar10] = (int)cVar4;
  }
  uVar10 = i + 0xc;
  if ((uVar10 == uVar8) && ((int)(j - 0xcU) < s2Len && 0xb < j)) {
    row[j - 0xcU] = (int)cVar5;
  }
  if ((((int)uVar10 < s1Len) && (-0xd < i)) && (j + -0xb == s2Len)) {
    col[uVar10] = (int)cVar5;
  }
  uVar10 = i + 0xd;
  if ((uVar10 == uVar8) && ((int)(j - 0xdU) < s2Len && 0xc < j)) {
    row[j - 0xdU] = (int)cVar6;
  }
  if ((((int)uVar10 < s1Len) && (-0xe < i)) && (j + -0xc == s2Len)) {
    col[uVar10] = (int)cVar6;
  }
  uVar10 = i + 0xe;
  if ((uVar10 == uVar8) && ((int)(j - 0xeU) < s2Len && 0xd < j)) {
    row[j - 0xeU] = (int)cVar7;
  }
  if ((((int)uVar10 < s1Len) && (-0xf < i)) && (j + -0xd == s2Len)) {
    col[uVar10] = (int)cVar7;
  }
  uVar10 = i + 0xf;
  if ((uVar10 == uVar8) && ((int)(j - 0xfU) < s2Len && 0xe < j)) {
    row[j - 0xfU] = (int)cVar9;
  }
  if ((((int)uVar10 < s1Len) && (-0x10 < i)) && (j + -0xe == s2Len)) {
    col[uVar10] = (int)cVar9;
  }
  uVar10 = i + 0x10;
  cVar1 = in_register_00001204[3];
  if ((uVar10 == uVar8) && ((int)(j - 0x10U) < s2Len && 0xf < j)) {
    row[j - 0x10U] = (int)cVar1;
  }
  if ((((int)uVar10 < s1Len) && (-0x11 < i)) && (j + -0xf == s2Len)) {
    col[uVar10] = (int)cVar1;
  }
  uVar10 = i + 0x11;
  cVar2 = in_register_00001204[2];
  if ((uVar10 == uVar8) && ((int)(j - 0x11U) < s2Len && 0x10 < j)) {
    row[j - 0x11U] = (int)cVar2;
  }
  if ((((int)uVar10 < s1Len) && (-0x12 < i)) && (j + -0x10 == s2Len)) {
    col[uVar10] = (int)cVar2;
  }
  uVar10 = i + 0x12;
  cVar3 = in_register_00001204[1];
  if ((uVar10 == uVar8) && ((int)(j - 0x12U) < s2Len && 0x11 < j)) {
    row[j - 0x12U] = (int)cVar3;
  }
  if ((((int)uVar10 < s1Len) && (-0x13 < i)) && (j + -0x11 == s2Len)) {
    col[uVar10] = (int)cVar3;
  }
  uVar10 = i + 0x13;
  cVar4 = in_register_00001204[0];
  if ((uVar10 == uVar8) && ((int)(j - 0x13U) < s2Len && 0x12 < j)) {
    row[j - 0x13U] = (int)cVar4;
  }
  if ((((int)uVar10 < s1Len) && (-0x14 < i)) && (j + -0x12 == s2Len)) {
    col[uVar10] = (int)cVar4;
  }
  uVar10 = i + 0x14;
  cVar5 = (char)((uint)in_XMM0_Da >> 0x18);
  if ((uVar10 == uVar8) && ((int)(j - 0x14U) < s2Len && 0x13 < j)) {
    row[j - 0x14U] = (int)cVar5;
  }
  if ((((int)uVar10 < s1Len) && (-0x15 < i)) && (j + -0x13 == s2Len)) {
    col[uVar10] = (int)cVar5;
  }
  uVar10 = i + 0x15;
  cVar6 = (char)((uint)in_XMM0_Da >> 0x10);
  if ((uVar10 == uVar8) && ((int)(j - 0x15U) < s2Len && 0x14 < j)) {
    row[j - 0x15U] = (int)cVar6;
  }
  if ((((int)uVar10 < s1Len) && (-0x16 < i)) && (j + -0x14 == s2Len)) {
    col[uVar10] = (int)cVar6;
  }
  uVar10 = i + 0x16;
  cVar7 = (char)((uint)in_XMM0_Da >> 8);
  if ((uVar10 == uVar8) && ((int)(j - 0x16U) < s2Len && 0x15 < j)) {
    row[j - 0x16U] = (int)cVar7;
  }
  if ((((int)uVar10 < s1Len) && (-0x17 < i)) && (j + -0x15 == s2Len)) {
    col[uVar10] = (int)cVar7;
  }
  uVar10 = i + 0x17;
  cVar9 = (char)in_XMM0_Da;
  if ((uVar10 == uVar8) && ((int)(j - 0x17U) < s2Len && 0x16 < j)) {
    row[j - 0x17U] = (int)cVar9;
  }
  if ((((int)uVar10 < s1Len) && (-0x18 < i)) && (j + -0x16 == s2Len)) {
    col[uVar10] = (int)cVar9;
  }
  uVar10 = i + 0x18;
  if ((uVar10 == uVar8) && ((int)(j - 0x18U) < s2Len && 0x17 < j)) {
    row[j - 0x18U] = (int)cVar1;
  }
  if ((((int)uVar10 < s1Len) && (-0x19 < i)) && (j + -0x17 == s2Len)) {
    col[uVar10] = (int)cVar1;
  }
  uVar10 = i + 0x19;
  if ((uVar10 == uVar8) && ((int)(j - 0x19U) < s2Len && 0x18 < j)) {
    row[j - 0x19U] = (int)cVar2;
  }
  if ((((int)uVar10 < s1Len) && (-0x1a < i)) && (j + -0x18 == s2Len)) {
    col[uVar10] = (int)cVar2;
  }
  uVar10 = i + 0x1a;
  if ((uVar10 == uVar8) && ((int)(j - 0x1aU) < s2Len && 0x19 < j)) {
    row[j - 0x1aU] = (int)cVar3;
  }
  if ((((int)uVar10 < s1Len) && (-0x1b < i)) && (j + -0x19 == s2Len)) {
    col[uVar10] = (int)cVar3;
  }
  uVar10 = i + 0x1b;
  if ((uVar10 == uVar8) && ((int)(j - 0x1bU) < s2Len && 0x1a < j)) {
    row[j - 0x1bU] = (int)cVar4;
  }
  if ((((int)uVar10 < s1Len) && (-0x1c < i)) && (j + -0x1a == s2Len)) {
    col[uVar10] = (int)cVar4;
  }
  uVar10 = i + 0x1c;
  if ((uVar10 == uVar8) && ((int)(j - 0x1cU) < s2Len && 0x1b < j)) {
    row[j - 0x1cU] = (int)cVar5;
  }
  if ((((int)uVar10 < s1Len) && (-0x1d < i)) && (j + -0x1b == s2Len)) {
    col[uVar10] = (int)cVar5;
  }
  uVar10 = i + 0x1d;
  if ((uVar10 == uVar8) && ((int)(j - 0x1dU) < s2Len && 0x1c < j)) {
    row[j - 0x1dU] = (int)cVar6;
  }
  if ((((int)uVar10 < s1Len) && (-0x1e < i)) && (j + -0x1c == s2Len)) {
    col[uVar10] = (int)cVar6;
  }
  uVar10 = i + 0x1e;
  if ((uVar10 == uVar8) && ((int)(j - 0x1eU) < s2Len && 0x1d < j)) {
    row[j - 0x1eU] = (int)cVar7;
  }
  if ((((int)uVar10 < s1Len) && (-0x1f < i)) && (j + -0x1d == s2Len)) {
    col[uVar10] = (int)cVar7;
  }
  uVar10 = i + 0x1f;
  if ((uVar10 == uVar8) && ((int)(j - 0x1fU) < s2Len && 0x1e < j)) {
    row[j - 0x1fU] = (int)cVar9;
  }
  if ((((int)uVar10 < s1Len) && (-0x20 < i)) && (j + -0x1e == s2Len)) {
    col[uVar10] = (int)cVar9;
  }
  return;
}

Assistant:

static inline void arr_store_rowcol(
        int *row,
        int *col,
        __m128i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (i+0 == s1Len-1 && 0 <= j-0 && j-0 < s2Len) {
        row[j-0] = (int8_t)_mm_extract_epi8(vWH, 15);
    }
    if (j-0 == s2Len-1 && 0 <= i+0 && i+0 < s1Len) {
        col[(i+0)] = (int8_t)_mm_extract_epi8(vWH, 15);
    }
    if (i+1 == s1Len-1 && 0 <= j-1 && j-1 < s2Len) {
        row[j-1] = (int8_t)_mm_extract_epi8(vWH, 14);
    }
    if (j-1 == s2Len-1 && 0 <= i+1 && i+1 < s1Len) {
        col[(i+1)] = (int8_t)_mm_extract_epi8(vWH, 14);
    }
    if (i+2 == s1Len-1 && 0 <= j-2 && j-2 < s2Len) {
        row[j-2] = (int8_t)_mm_extract_epi8(vWH, 13);
    }
    if (j-2 == s2Len-1 && 0 <= i+2 && i+2 < s1Len) {
        col[(i+2)] = (int8_t)_mm_extract_epi8(vWH, 13);
    }
    if (i+3 == s1Len-1 && 0 <= j-3 && j-3 < s2Len) {
        row[j-3] = (int8_t)_mm_extract_epi8(vWH, 12);
    }
    if (j-3 == s2Len-1 && 0 <= i+3 && i+3 < s1Len) {
        col[(i+3)] = (int8_t)_mm_extract_epi8(vWH, 12);
    }
    if (i+4 == s1Len-1 && 0 <= j-4 && j-4 < s2Len) {
        row[j-4] = (int8_t)_mm_extract_epi8(vWH, 11);
    }
    if (j-4 == s2Len-1 && 0 <= i+4 && i+4 < s1Len) {
        col[(i+4)] = (int8_t)_mm_extract_epi8(vWH, 11);
    }
    if (i+5 == s1Len-1 && 0 <= j-5 && j-5 < s2Len) {
        row[j-5] = (int8_t)_mm_extract_epi8(vWH, 10);
    }
    if (j-5 == s2Len-1 && 0 <= i+5 && i+5 < s1Len) {
        col[(i+5)] = (int8_t)_mm_extract_epi8(vWH, 10);
    }
    if (i+6 == s1Len-1 && 0 <= j-6 && j-6 < s2Len) {
        row[j-6] = (int8_t)_mm_extract_epi8(vWH, 9);
    }
    if (j-6 == s2Len-1 && 0 <= i+6 && i+6 < s1Len) {
        col[(i+6)] = (int8_t)_mm_extract_epi8(vWH, 9);
    }
    if (i+7 == s1Len-1 && 0 <= j-7 && j-7 < s2Len) {
        row[j-7] = (int8_t)_mm_extract_epi8(vWH, 8);
    }
    if (j-7 == s2Len-1 && 0 <= i+7 && i+7 < s1Len) {
        col[(i+7)] = (int8_t)_mm_extract_epi8(vWH, 8);
    }
    if (i+8 == s1Len-1 && 0 <= j-8 && j-8 < s2Len) {
        row[j-8] = (int8_t)_mm_extract_epi8(vWH, 7);
    }
    if (j-8 == s2Len-1 && 0 <= i+8 && i+8 < s1Len) {
        col[(i+8)] = (int8_t)_mm_extract_epi8(vWH, 7);
    }
    if (i+9 == s1Len-1 && 0 <= j-9 && j-9 < s2Len) {
        row[j-9] = (int8_t)_mm_extract_epi8(vWH, 6);
    }
    if (j-9 == s2Len-1 && 0 <= i+9 && i+9 < s1Len) {
        col[(i+9)] = (int8_t)_mm_extract_epi8(vWH, 6);
    }
    if (i+10 == s1Len-1 && 0 <= j-10 && j-10 < s2Len) {
        row[j-10] = (int8_t)_mm_extract_epi8(vWH, 5);
    }
    if (j-10 == s2Len-1 && 0 <= i+10 && i+10 < s1Len) {
        col[(i+10)] = (int8_t)_mm_extract_epi8(vWH, 5);
    }
    if (i+11 == s1Len-1 && 0 <= j-11 && j-11 < s2Len) {
        row[j-11] = (int8_t)_mm_extract_epi8(vWH, 4);
    }
    if (j-11 == s2Len-1 && 0 <= i+11 && i+11 < s1Len) {
        col[(i+11)] = (int8_t)_mm_extract_epi8(vWH, 4);
    }
    if (i+12 == s1Len-1 && 0 <= j-12 && j-12 < s2Len) {
        row[j-12] = (int8_t)_mm_extract_epi8(vWH, 3);
    }
    if (j-12 == s2Len-1 && 0 <= i+12 && i+12 < s1Len) {
        col[(i+12)] = (int8_t)_mm_extract_epi8(vWH, 3);
    }
    if (i+13 == s1Len-1 && 0 <= j-13 && j-13 < s2Len) {
        row[j-13] = (int8_t)_mm_extract_epi8(vWH, 2);
    }
    if (j-13 == s2Len-1 && 0 <= i+13 && i+13 < s1Len) {
        col[(i+13)] = (int8_t)_mm_extract_epi8(vWH, 2);
    }
    if (i+14 == s1Len-1 && 0 <= j-14 && j-14 < s2Len) {
        row[j-14] = (int8_t)_mm_extract_epi8(vWH, 1);
    }
    if (j-14 == s2Len-1 && 0 <= i+14 && i+14 < s1Len) {
        col[(i+14)] = (int8_t)_mm_extract_epi8(vWH, 1);
    }
    if (i+15 == s1Len-1 && 0 <= j-15 && j-15 < s2Len) {
        row[j-15] = (int8_t)_mm_extract_epi8(vWH, 0);
    }
    if (j-15 == s2Len-1 && 0 <= i+15 && i+15 < s1Len) {
        col[(i+15)] = (int8_t)_mm_extract_epi8(vWH, 0);
    }
}